

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int>::TestBody
          (SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int> *this)

{
  bool bVar1;
  type this_00;
  reference pvVar2;
  char *pcVar3;
  initializer_list<unsigned_long> indices;
  initializer_list<(anonymous_namespace)::ctor_counter> values;
  AssertHelper local_e8;
  Message local_e0;
  uint local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  uint local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int> *arr;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 *local_28;
  iterator local_20;
  unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  local_18;
  unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  arrp;
  SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int> *this_local;
  
  (anonymous_namespace)::ctor_counter::ctors = 0;
  local_48 = 0;
  uStack_40 = 2;
  local_38 = 4;
  local_28 = &local_48;
  local_20 = (iterator)0x3;
  arrp._M_t.
  super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  .
  super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>,_true,_true>
        )(__uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>,_true,_true>
          )this;
  std::initializer_list<(anonymous_namespace)::ctor_counter>::initializer_list
            ((initializer_list<(anonymous_namespace)::ctor_counter> *)&arr);
  indices._M_len = (size_type)local_28;
  indices._M_array = (iterator)&local_18;
  values._M_len = (size_type)arr;
  values._M_array = local_20;
  pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>::make_unique
            (indices,values);
  this_00 = std::
            unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
            ::operator*(&local_18);
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>::operator[]
                     (this_00,0);
  local_84 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_80,"arr[0].v","0U",&pvVar2->v,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>::operator[]
                     (this_00,2);
  local_ac = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_a8,"arr[2].v","1U",&pvVar2->v,&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>::operator[]
                     (this_00,4);
  local_d4 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_d0,"arr[4].v","2U",&pvVar2->v,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::
  unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_unsigned_int>_>_>
  ::~unique_ptr(&local_18);
  return;
}

Assistant:

TYPED_TEST (SparseArray, IndexInitializationListCtorCheck) {
    ctor_counter::ctors = 0;

    auto arrp = sparse_array<ctor_counter, TypeParam>::make_unique ({0, 2, 4});
    auto & arr = *arrp;
    EXPECT_EQ (arr[0].v, 0U);
    EXPECT_EQ (arr[2].v, 1U);
    EXPECT_EQ (arr[4].v, 2U);
}